

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O0

base_learner * classweight_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  size_type sVar3;
  base_learner *this_00;
  string *pmessage;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  stringstream __msg;
  string *in_stack_000000b8;
  classweights *in_stack_000000c0;
  learner<CLASSWEIGHTS::classweights,_example> *ret;
  single_learner *base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  option_group_definition new_options;
  free_ptr<CLASSWEIGHTS::classweights> cweights;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classweight_array;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb38;
  vw *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  learner<CLASSWEIGHTS::classweights,_example> *in_stack_fffffffffffffb50;
  int plineNumber;
  ostream *in_stack_fffffffffffffb68;
  vw_exception *in_stack_fffffffffffffb70;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb88;
  option_group_definition *in_stack_fffffffffffffb90;
  allocator *paVar5;
  stringstream local_420 [16];
  ostream local_410;
  learner<char,_char> *in_stack_fffffffffffffd00;
  learner<CLASSWEIGHTS::classweights,_example> *local_298;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  undefined1 *local_270;
  undefined4 local_268;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [359];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [88];
  undefined1 local_30 [24];
  long local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x318774);
  scoped_calloc_or_throw<CLASSWEIGHTS::classweights>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"importance weight classes",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"classweight",&local_211);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffb48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"importance weight multiplier for class",&local_239);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffb40,(string *)in_stack_fffffffffffffb38);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  (**(code **)*local_10)(local_10,local_88);
  paVar5 = &local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"classweight",paVar5);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_260);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_270 = local_30;
    local_278._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffb38);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffb40,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffb38);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_278);
      std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::operator->
                ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)0x318ba9);
      CLASSWEIGHTS::classweights::load_string(in_stack_000000c0,in_stack_000000b8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_278);
    }
    if ((*(byte *)(local_18 + 0x3439) & 1) == 0) {
      this = std::operator<<((ostream *)(local_18 + 0xe0),"parsed ");
      std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::operator->
                ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)0x318c0c);
      sVar3 = std::
              unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
              ::size((unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                      *)0x318c14);
      in_stack_fffffffffffffb70 = (vw_exception *)std::ostream::operator<<(this,sVar3);
      in_stack_fffffffffffffb68 =
           std::operator<<((ostream *)in_stack_fffffffffffffb70," class weights");
      std::ostream::operator<<(in_stack_fffffffffffffb68,std::endl<char,std::char_traits<char>>);
    }
    this_00 = setup_base((options_i *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    pmessage = (string *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffffd00);
    if (*(int *)&pmessage[6].field_2 == 0) {
      in_stack_fffffffffffffb50 =
           LEARNER::init_learner<CLASSWEIGHTS::classweights,example,LEARNER::learner<char,example>>
                     ((free_ptr<CLASSWEIGHTS::classweights> *)in_stack_fffffffffffffb50,
                      (learner<char,_example> *)in_stack_fffffffffffffb48,
                      (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffb40,
                      (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffb38);
      local_298 = in_stack_fffffffffffffb50;
    }
    else {
      if (*(int *)&pmessage[6].field_2 != 4) {
        std::__cxx11::stringstream::stringstream(local_420);
        plineNumber = (int)((ulong)this_00 >> 0x20);
        std::operator<<(&local_410,"--classweight not implemented for this type of prediction");
        uVar4 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,plineNumber,pmessage)
        ;
        __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_298 = LEARNER::
                  init_learner<CLASSWEIGHTS::classweights,example,LEARNER::learner<char,example>>
                            ((free_ptr<CLASSWEIGHTS::classweights> *)in_stack_fffffffffffffb50,
                             (learner<char,_example> *)in_stack_fffffffffffffb48,
                             (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffb40,
                             (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffb38);
    }
    LEARNER::learner<CLASSWEIGHTS::classweights,_example>::set_finish
              ((learner<CLASSWEIGHTS::classweights,_example> *)this_00,
               (_func_void_classweights_ptr *)pmessage);
    local_8 = LEARNER::make_base<CLASSWEIGHTS::classweights,example>(local_298);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_268 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb40);
  std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)in_stack_fffffffffffffb50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb50);
  return local_8;
}

Assistant:

LEARNER::base_learner* classweight_setup(options_i& options, vw& all)
{
  vector<string> classweight_array;
  auto cweights = scoped_calloc_or_throw<classweights>();
  option_group_definition new_options("importance weight classes");
  new_options.add(make_option("classweight", classweight_array).help("importance weight multiplier for class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("classweight"))
    return nullptr;

  for (auto& s : classweight_array) cweights->load_string(s);

  if (!all.quiet)
    all.trace_message << "parsed " << cweights->weights.size() << " class weights" << endl;

  LEARNER::single_learner* base = as_singleline(setup_base(options, all));

  LEARNER::learner<classweights, example>* ret;
  if (base->pred_type == prediction_type::scalar)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::scalar>,
        predict_or_learn<false, prediction_type::scalar>);
  else if (base->pred_type == prediction_type::multiclass)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::multiclass>,
        predict_or_learn<false, prediction_type::multiclass>);
  else
    THROW("--classweight not implemented for this type of prediction");
  ret->set_finish(finish);
  return make_base(*ret);
}